

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack27_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7ffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1b;
  *puVar1 = (in[1] & 0x3fffff) << 5 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x16;
  *puVar1 = (in[2] & 0x1ffff) << 10 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x11;
  *puVar1 = (in[3] & 0xfff) << 0xf | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0xc;
  *puVar1 = (in[4] & 0x7f) << 0x14 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 7;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 3) << 0x19 | *puVar1;
  out[6] = *puVar2 >> 2 & 0x7ffffff;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1d;
  *puVar1 = (in[6] & 0xffffff) << 3 | *puVar1;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack27_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 22)) << (27 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 17)) << (27 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 12)) << (27 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 7)) << (27 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 2)) << (27 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 27);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 24)) << (27 - 24);
  out++;

  return in + 1;
}